

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O2

void __thiscall
duckdb::ForeignKeyConstraint::Serialize(ForeignKeyConstraint *this,Serializer *serializer)

{
  Constraint::Serialize(&this->super_Constraint,serializer);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,200,"pk_columns",&this->pk_columns);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xc9,"fk_columns",&this->fk_columns);
  Serializer::WriteProperty<duckdb::ForeignKeyType>(serializer,0xca,"fk_type",&(this->info).type);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xcb,"schema",&(this->info).schema);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xcc,"table",&(this->info).table);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (serializer,0xcd,"pk_keys",&(this->info).pk_keys);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (serializer,0xce,"fk_keys",&(this->info).fk_keys);
  return;
}

Assistant:

void ForeignKeyConstraint::Serialize(Serializer &serializer) const {
	Constraint::Serialize(serializer);
	serializer.WritePropertyWithDefault<vector<string>>(200, "pk_columns", pk_columns);
	serializer.WritePropertyWithDefault<vector<string>>(201, "fk_columns", fk_columns);
	serializer.WriteProperty<ForeignKeyType>(202, "fk_type", info.type);
	serializer.WritePropertyWithDefault<string>(203, "schema", info.schema);
	serializer.WritePropertyWithDefault<string>(204, "table", info.table);
	serializer.WritePropertyWithDefault<vector<PhysicalIndex>>(205, "pk_keys", info.pk_keys);
	serializer.WritePropertyWithDefault<vector<PhysicalIndex>>(206, "fk_keys", info.fk_keys);
}